

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cues::Write(Cues *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64_t uVar2;
  long lVar3;
  long lVar4;
  long *in_RSI;
  Cues *in_RDI;
  int64_t stop_position;
  CuePoint *cue_1;
  int32_t i_1;
  int64_t payload_position;
  CuePoint *cue;
  int32_t i;
  uint64_t size;
  CuePoint *in_stack_ffffffffffffffb0;
  IMkvWriter *in_stack_ffffffffffffffb8;
  int local_3c;
  CuePoint *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int index;
  long local_20;
  bool local_1;
  
  if (in_RSI == (long *)0x0) {
    local_1 = false;
  }
  else {
    local_20 = 0;
    for (index = 0; index < in_RDI->cue_entries_size_; index = index + 1) {
      in_stack_ffffffffffffffd0 = GetCueByIndex(in_RDI,index);
      if (in_stack_ffffffffffffffd0 == (CuePoint *)0x0) {
        return false;
      }
      uVar2 = CuePoint::Size(in_stack_ffffffffffffffb0);
      local_20 = uVar2 + local_20;
    }
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffb8,(uint64)in_stack_ffffffffffffffb0,(uint64)in_RDI);
    if (bVar1) {
      lVar3 = (**(code **)(*in_RSI + 8))();
      if (lVar3 < 0) {
        local_1 = false;
      }
      else {
        for (local_3c = 0; local_3c < in_RDI->cue_entries_size_; local_3c = local_3c + 1) {
          GetCueByIndex(in_RDI,local_3c);
          bVar1 = CuePoint::Write((CuePoint *)CONCAT44(index,in_stack_ffffffffffffffd8),
                                  (IMkvWriter *)in_stack_ffffffffffffffd0);
          if (!bVar1) {
            return false;
          }
        }
        lVar4 = (**(code **)(*in_RSI + 8))();
        if (lVar4 < 0) {
          local_1 = false;
        }
        else if (lVar4 - lVar3 == local_20) {
          local_1 = true;
        }
        else {
          local_1 = false;
        }
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool Cues::Write(IMkvWriter* writer) const {
  if (!writer)
    return false;

  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i) {
    const CuePoint* const cue = GetCueByIndex(i);

    if (!cue)
      return false;

    size += cue->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCues, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < cue_entries_size_; ++i) {
    const CuePoint* const cue = GetCueByIndex(i);

    if (!cue->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0)
    return false;

  if (stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}